

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetItemDefaultFocus(void)

{
  ImRect *r;
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  bool bVar2;
  ImRect IVar3;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  if ((((window->Appearing == true) && (GImGui->NavWindow == window->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (window->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar1->NavInitResultId = (pIVar1->LastItemData).ID;
    r = &(pIVar1->LastItemData).Rect;
    IVar3 = WindowRectAbsToRel(window,r);
    pIVar1->NavInitResultRectRel = IVar3;
    pIVar1 = GImGui;
    bVar2 = true;
    if (GImGui->NavMoveScoringItems == false) {
      bVar2 = GImGui->NavInitRequest;
    }
    GImGui->NavAnyRequest = bVar2;
    if (((pIVar1->LastItemData).StatusFlags & 0x200) == 0) {
      ScrollToRectEx(window,r,0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResultId == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    g.NavInitResultId = g.LastItemData.ID;
    g.NavInitResultRectRel = WindowRectAbsToRel(window, g.LastItemData.Rect);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via an opt-in flag (we however don't want regular init requests to scroll)
    if (!IsItemVisible())
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}